

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamHeader_p.cpp
# Opt level: O2

void __thiscall
BamTools::Internal::BamHeader::ReadHeaderLength(BamHeader *this,BgzfStream *stream,uint32_t *length)

{
  size_t sVar1;
  BamException *this_00;
  allocator local_5e;
  allocator local_5d;
  char buffer [4];
  string local_58;
  string local_38;
  
  sVar1 = BgzfStream::Read(stream,buffer,4);
  if (sVar1 == 4) {
    *length = (uint32_t)buffer;
    return;
  }
  this_00 = (BamException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&local_38,"BamHeader::ReadHeaderLength",&local_5d);
  std::__cxx11::string::string((string *)&local_58,"could not read header length",&local_5e);
  BamException::BamException(this_00,&local_38,&local_58);
  __cxa_throw(this_00,&BamException::typeinfo,BamException::~BamException);
}

Assistant:

void BamHeader::ReadHeaderLength(BgzfStream* stream, uint32_t& length)
{

    // read BAM header text length
    char buffer[sizeof(uint32_t)];
    const std::size_t numBytesRead = stream->Read(buffer, sizeof(uint32_t));
    if (numBytesRead != sizeof(uint32_t))
        throw BamException("BamHeader::ReadHeaderLength", "could not read header length");

    // convert char buffer to length
    length = BamTools::UnpackUnsignedInt(buffer);
    if (BamTools::SystemIsBigEndian()) BamTools::SwapEndian_32(length);
}